

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack)

{
  HighsDomainChange *pHVar1;
  HighsBoundType HVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer piVar5;
  pointer piVar6;
  pointer ppVar7;
  pointer pRVar8;
  uint uVar9;
  ulong uVar10;
  pointer pHVar11;
  pointer piVar12;
  uint uVar13;
  
  this->infeasible_ = false;
  pHVar3 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar3 != pHVar4) {
    piVar5 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar11 = pHVar3;
    do {
      piVar12 = piVar6;
      if (pHVar11->boundtype == kLower) {
        piVar12 = piVar5;
      }
      piVar12[pHVar11->column] = -1;
      pHVar11 = pHVar11 + 1;
    } while (pHVar11 != pHVar4);
  }
  ppVar7 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar7) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar7;
  }
  if (pHVar3 != pHVar4) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  pRVar8 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar8) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar8;
  }
  piVar5 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar5;
  }
  uVar13 = (uint)((ulong)((long)(domchgstack->
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(domchgstack->
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (uVar13 != 0) {
    uVar10 = 0;
    do {
      pHVar3 = (domchgstack->
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pHVar1 = pHVar3 + uVar10;
      HVar2 = pHVar3[uVar10].boundtype;
      if (HVar2 == kUpper) {
        if (pHVar1->boundval <
            (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[pHVar1->column]) goto LAB_0029add1;
      }
      else if ((HVar2 != kLower) ||
              ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[pHVar1->column] < pHVar1->boundval)) {
LAB_0029add1:
        changeBound(this,*pHVar1,(Reason)0xfffffffe);
        if (this->infeasible_ != false) {
          return;
        }
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != uVar13);
  }
  return;
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  for (HighsInt k = 0; k != stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    changeBound(domchgstack[k], Reason::unspecified());

    if (infeasible_) break;
  }
}